

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3DbIsNamed(sqlite3 *db,int iDb,char *zName)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = sqlite3StrICmp(db->aDb[iDb].zDbSName,zName);
  if (iVar1 == 0) {
    uVar2 = 1;
  }
  else {
    uVar2 = 0;
    if (iDb == 0) {
      iVar1 = sqlite3StrICmp("main",zName);
      uVar2 = (uint)(iVar1 == 0);
    }
  }
  return uVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3DbIsNamed(sqlite3 *db, int iDb, const char *zName){
  return (
      sqlite3StrICmp(db->aDb[iDb].zDbSName, zName)==0
   || (iDb==0 && sqlite3StrICmp("main", zName)==0)
  );
}